

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint RDL_getSSSR(RDL_data *data,RDL_cycle ***ptr)

{
  RDL_graph *pRVar1;
  char *pcVar2;
  RDL_URFinfo **ppRVar3;
  RDL_URFinfo *pRVar4;
  long *plVar5;
  long lVar6;
  uchar uVar7;
  int iVar8;
  uchar **rows;
  uchar **rows_00;
  uchar *empty_cycle;
  uchar *cycle;
  undefined8 *puVar9;
  void *pvVar10;
  RDL_cycle **ppRVar11;
  int iVar12;
  uint nof_rows;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong __size;
  uint pos;
  uint *puVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uchar **compressed;
  ulong local_b0;
  int local_a0;
  uint local_9c;
  void *local_90;
  int local_88;
  int local_84;
  ulong local_68;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    ppRVar11 = (RDL_cycle **)malloc(8);
    uVar18 = 0xffffffff;
  }
  else if (data->nofURFs == 0) {
    ppRVar11 = (RDL_cycle **)malloc(8);
    uVar18 = 0;
  }
  else {
    pRVar1 = data->graph;
    local_68 = 0x40;
    if (pRVar1->V <= pRVar1->E) {
      local_68 = (ulong)((pRVar1->E - pRVar1->V) + 1);
    }
    local_90 = malloc(local_68 * 8);
    uVar19 = 0;
    local_b0 = 0;
    local_a0 = 0;
    local_88 = 0;
    local_9c = 0;
    while( true ) {
      uVar18 = (uint)local_b0;
      if (data->bccGraphs->nof_bcc <= uVar19) break;
      pRVar1 = data->bccGraphs->bcc_graphs[uVar19];
      iVar12 = pRVar1->E - pRVar1->V;
      rows = (uchar **)malloc((ulong)(iVar12 + 1) << 3);
      puVar16 = data->nofURFsPerBCC;
      uVar14 = (ulong)puVar16[uVar19];
      rows_00 = (uchar **)malloc(uVar14 << 3);
      compressed = rows_00;
      for (uVar13 = 0; uVar13 < uVar14; uVar13 = uVar13 + 1) {
        local_9c = RDL_bitset_compressed
                             (compressed,(*data->urfInfoPerBCC[uVar19]->URFs[uVar13])->prototype,
                              pRVar1->E);
        puVar16 = data->nofURFsPerBCC;
        uVar14 = (ulong)puVar16[uVar19];
        compressed = compressed + 1;
      }
      __size = (ulong)local_9c;
      empty_cycle = (uchar *)calloc(1,__size);
      local_84 = 0;
      uVar14 = 0;
      for (uVar13 = 0; uVar13 < puVar16[uVar19]; uVar13 = uVar13 + 1) {
        cycle = (uchar *)malloc(__size);
        memcpy(cycle,rows_00[uVar13],__size);
        for (uVar17 = 0; uVar14 != uVar17; uVar17 = uVar17 + 1) {
          uVar7 = RDL_bitset_test(cycle,(uint)uVar17);
          if (uVar7 != '\0') {
            RDL_bitset_xor_inplace(cycle,rows[uVar17],local_9c);
          }
        }
        iVar8 = RDL_bitset_empty(cycle,empty_cycle,local_9c);
        if (iVar8 == 0) {
          rows[uVar14] = cycle;
          uVar15 = (uint)uVar14;
          nof_rows = uVar15 + 1;
          uVar14 = (ulong)nof_rows;
          uVar7 = RDL_bitset_test(cycle,uVar15);
          pos = nof_rows;
          if (uVar7 == '\0') {
            for (; pos < pRVar1->E; pos = pos + 1) {
              uVar7 = RDL_bitset_test(cycle,pos);
              if (uVar7 != '\0') {
                RDL_swap_columns(rows,nof_rows,uVar15,pos);
                RDL_swap_columns(rows_00,data->nofURFsPerBCC[uVar19],uVar15,pos);
                break;
              }
            }
          }
          pcVar2 = (*data->urfInfoPerBCC[uVar19]->URFs[uVar13])->prototype;
          if ((uint)local_68 <= uVar18) {
            local_68 = (ulong)((uint)local_68 * 2);
            local_90 = realloc(local_90,local_68 * 8);
          }
          puVar9 = (undefined8 *)malloc(0x18);
          *(undefined8 **)((long)local_90 + (ulong)uVar18 * 8) = puVar9;
          ppRVar3 = data->urfInfoPerBCC;
          pvVar10 = malloc((ulong)(*ppRVar3[uVar19]->URFs[uVar13])->weight << 3);
          *puVar9 = pvVar10;
          pRVar4 = ppRVar3[uVar19];
          plVar5 = *(long **)((long)local_90 + (ulong)uVar18 * 8);
          *(uint *)(plVar5 + 1) = (*pRVar4->URFs[uVar13])->weight;
          *(int *)((long)plVar5 + 0xc) = local_a0;
          *(int *)(plVar5 + 2) = local_88;
          uVar15 = 0;
          for (uVar17 = 0; uVar17 < pRVar1->E; uVar17 = uVar17 + 1) {
            if (pcVar2[uVar17] == '\x01') {
              puVar16 = data->graph->edges[data->bccGraphs->edge_from_bcc_mapping[uVar19][uVar17]];
              lVar6 = *plVar5;
              *(uint *)(lVar6 + (ulong)uVar15 * 8) = *puVar16;
              *(uint *)(lVar6 + 4 + (ulong)uVar15 * 8) = puVar16[1];
              uVar15 = uVar15 + 1;
            }
          }
          local_88 = local_88 + pRVar4->nofCFsPerURF[uVar13];
          uVar18 = uVar18 + 1;
          if (local_84 == iVar12) break;
          local_84 = local_84 + 1;
        }
        else {
          free(cycle);
        }
        local_a0 = local_a0 + 1;
        puVar16 = data->nofURFsPerBCC;
      }
      local_b0 = (ulong)uVar18;
      for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        free(rows[uVar13]);
      }
      free(rows);
      for (uVar13 = 0; uVar13 < data->nofURFsPerBCC[uVar19]; uVar13 = uVar13 + 1) {
        free(rows_00[uVar13]);
      }
      free(rows_00);
      free(empty_cycle);
      uVar19 = uVar19 + 1;
    }
    ppRVar11 = (RDL_cycle **)realloc(local_90,local_b0 << 3);
  }
  *ptr = ppRVar11;
  return uVar18;
}

Assistant:

unsigned RDL_getSSSR(const RDL_data *data, RDL_cycle ***ptr)
{
  unsigned j, k, rcf=0, urf=0;
  RDL_cycle **result;
  unsigned size, added, currBond;
  unsigned bcc_index, internal_index;
  char* prototype;
  const RDL_graph* curr_graph;
  unsigned total_counter, alloced;
  unsigned edge;
  unsigned char *currentCycle;
  unsigned char **basisCycles;
  unsigned char **prototypesForGaussian;
  unsigned currentBasisCyclesSize;
  unsigned oldBasisCyclesSize;
  unsigned compressedSize = 0;
  const unsigned char* empty_cycle;


  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  total_counter = 0;
  if (data->graph->E < data->graph->V) {
    /*
     * if E - V + 1 < 1  <=> E - V < 0 <=> E < V
     *
     * graph is not connected and our heuristic for reservation
     * fails => allocate something ;)
     * */
    alloced = RDL_RESERVED_START;
  }
  else {
    alloced = data->graph->E - data->graph->V + 1;
  }
  result = malloc(alloced * sizeof(*result));

  /* calculate basis for each BCC (and therefore for each CC) */

  for (bcc_index = 0; bcc_index < data->bccGraphs->nof_bcc; ++bcc_index) {
    curr_graph = data->bccGraphs->bcc_graphs[bcc_index];

    size=curr_graph->E - curr_graph->V + 1;

    basisCycles = malloc(size * sizeof(*basisCycles));
    prototypesForGaussian =
        malloc(data->nofURFsPerBCC[bcc_index] * sizeof(*prototypesForGaussian));

    /* copy the prototypes for gaussian elimination */
    /*
     * it is sufficient to take the first prototype for each URF
     * (the other's are linearly dependent anyway
     */
    for (internal_index = 0;
        internal_index < data->nofURFsPerBCC[bcc_index]; ++internal_index) {
      compressedSize = RDL_bitset_compressed(&(prototypesForGaussian[internal_index]),
          data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->prototype,
          curr_graph->E);
    }

    empty_cycle = malloc(compressedSize * sizeof(*empty_cycle));
    memset((unsigned char*)empty_cycle, 0, compressedSize * sizeof(*empty_cycle));

    added = 0;
    currentBasisCyclesSize = 0;

    for (internal_index = 0;
        internal_index < data->nofURFsPerBCC[bcc_index]; ++internal_index, ++urf) {

      currentCycle = malloc(compressedSize * sizeof(*currentCycle));
      memcpy(currentCycle, prototypesForGaussian[internal_index],
          compressedSize * sizeof(*currentCycle));

      /*
       * basisCycles is in row echelon form!result = realloc(result, nextfree * sizeof(*result));
       * [this corresponds to "add row operation"]
       */
      for (k = 0; k < currentBasisCyclesSize; ++k) {
        if (RDL_bitset_test(currentCycle, k)) {
          RDL_bitset_xor_inplace(currentCycle, basisCycles[k], compressedSize);
        }
      }

      if (RDL_bitset_empty(currentCycle, empty_cycle, compressedSize)) {
        free(currentCycle);
        continue;
      }
      /*
       * the current cycle is indepedent of equal and smaller
       * sized cycles => part of the basis
       */
      oldBasisCyclesSize = currentBasisCyclesSize;
      basisCycles[currentBasisCyclesSize] = currentCycle;
      ++currentBasisCyclesSize;

      /*
       * this is where the magic is happening: ensure that the basis is
       * indeed in row echelon form (we use the property throughout the algorithm)
       *
       * swap columns such that indeed the current ring with index currentBasisCycleSize-1
       * has a 1 at column currentBasisCycleSize-1
       * => ROW ECHELON FORM
       *
       * [this corresponds to the "swap columns operation" of gaussian elimination]
       */
      if (!RDL_bitset_test(currentCycle, oldBasisCyclesSize)) {
        for (k = oldBasisCyclesSize + 1; k < curr_graph->E; ++k) {
          if (RDL_bitset_test(currentCycle, k)) {
            RDL_swap_columns(basisCycles, currentBasisCyclesSize, oldBasisCyclesSize, k);
            RDL_swap_columns(prototypesForGaussian, data->nofURFsPerBCC[bcc_index], oldBasisCyclesSize, k);
            break;
          }
        }
      }

      prototype = data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->prototype;

      /* can happen for unconnected graphs */
      if (total_counter >= alloced) {
        alloced *= 2;
        result = realloc(result, (alloced) * sizeof(*result));
      }

      currBond = 0;
      result[total_counter] = malloc(sizeof(**result));
      result[total_counter]->edges = malloc(data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->weight *
                                   sizeof(*(result[total_counter]->edges)));
      result[total_counter]->weight = data->urfInfoPerBCC[bcc_index]->URFs[internal_index][0]->weight;
      result[total_counter]->urf = urf;
      result[total_counter]->rcf = rcf;
      for(j=0; j < curr_graph->E; ++j) {
        if(prototype[j] == 1) {
          edge = data->bccGraphs->edge_from_bcc_mapping[bcc_index][j];
          result[total_counter]->edges[currBond][0] = data->graph->edges[edge][0];
          result[total_counter]->edges[currBond][1] = data->graph->edges[edge][1];
          ++currBond;
        }
      }

      rcf += data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[internal_index];

      /*if enough inRDL_dependent cycles were found, break out of the loop*/
      ++total_counter;
      if(++added == size) {
        break;
      }
    }

    for (k = 0; k < currentBasisCyclesSize; ++k) {
      free(basisCycles[k]);
    }
    free(basisCycles);

    for (k = 0; k < data->nofURFsPerBCC[bcc_index]; ++k) {
      free(prototypesForGaussian[k]);
    }
    free(prototypesForGaussian);
    free((void*)empty_cycle);
  }

  result = realloc(result, total_counter * sizeof(*result));

  (*ptr) = result;
  return total_counter;
}